

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O2

void __thiscall btDbvt::update(btDbvt *this,btDbvtNode *leaf,int lookahead)

{
  btDbvtNode *pbVar1;
  int iVar2;
  btDbvtNode *root;
  
  pbVar1 = removeleaf(this,leaf);
  if (pbVar1 == (btDbvtNode *)0x0) {
    root = (btDbvtNode *)0x0;
  }
  else if (lookahead < 0) {
    root = this->m_root;
  }
  else {
    iVar2 = lookahead + 1;
    do {
      root = pbVar1;
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) break;
      pbVar1 = root->parent;
    } while (root->parent != (btDbvtNode *)0x0);
  }
  insertleaf(this,root,leaf);
  return;
}

Assistant:

void			btDbvt::update(btDbvtNode* leaf,int lookahead)
{
	btDbvtNode*	root=removeleaf(this,leaf);
	if(root)
	{
		if(lookahead>=0)
		{
			for(int i=0;(i<lookahead)&&root->parent;++i)
			{
				root=root->parent;
			}
		} else root=m_root;
	}
	insertleaf(this,root,leaf);
}